

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
               (QWindow *args,QFlags<Qt::WindowState> args_1,QFlags<Qt::WindowState> args_2)

{
  long lVar1;
  QWindow *in_RDI;
  long in_FS_OFFSET;
  QFlags<Qt::WindowState> in_stack_00000018;
  QFlags<Qt::WindowState> in_stack_0000001c;
  QWindow *in_stack_ffffffffffffffc8;
  undefined1 local_29;
  QFlags<Qt::WindowState> in_stack_ffffffffffffffe8;
  QFlags<Qt::WindowState> in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    local_29 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
               handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
                         (in_stack_ffffffffffffffc8,in_stack_0000001c,in_stack_00000018);
  }
  else {
    local_29 = QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
               handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
                         (in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}